

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

archive * archive_read_disk_new(void)

{
  archive_vtable_conflict *paVar1;
  archive_read_disk *a;
  archive *local_8;
  
  local_8 = (archive *)calloc(1,0x100);
  if (local_8 == (archive *)0x0) {
    local_8 = (archive *)0x0;
  }
  else {
    local_8->magic = 0xbadb0c5;
    local_8->state = 1;
    paVar1 = archive_read_disk_vtable();
    local_8->vtable = paVar1;
    local_8[1].error_string.buffer_length = (size_t)trivial_lookup_uname;
    local_8[1].error = (char *)trivial_lookup_gname;
    local_8[1].file_count = 1;
    local_8[1].archive_error_number = 1;
    *(code **)&local_8[1].archive_format = open_on_current_dir;
    local_8[1].archive_format_name = (char *)tree_current_dir_fd;
    *(code **)&local_8[1].compression_code = tree_enter_working_dir;
  }
  return local_8;
}

Assistant:

struct archive *
archive_read_disk_new(void)
{
	struct archive_read_disk *a;

	a = (struct archive_read_disk *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_READ_DISK_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	a->archive.vtable = archive_read_disk_vtable();
	a->lookup_uname = trivial_lookup_uname;
	a->lookup_gname = trivial_lookup_gname;
	a->enable_copyfile = 1;
	a->traverse_mount_points = 1;
	a->open_on_current_dir = open_on_current_dir;
	a->tree_current_dir_fd = tree_current_dir_fd;
	a->tree_enter_working_dir = tree_enter_working_dir;
	return (&a->archive);
}